

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::TypeCast::TypeCast(TypeCast *this,Context *c,Type *destType,Expression *sourceValue)

{
  SourceCodeText *pSVar1;
  Category CVar2;
  bool bVar3;
  bool bVar4;
  BoundedIntSize BVar5;
  
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__ASTObject_002d4778;
  (this->super_Expression).super_Statement.super_ASTObject.objectType = TypeCast;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_Expression).super_Statement.super_ASTObject.context.location.sourceCode.object =
       pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_Expression).super_Statement.super_ASTObject.context.location.location.data =
       (c->location).location.data;
  (this->super_Expression).super_Statement.super_ASTObject.context.parentScope = c->parentScope;
  (this->super_Expression).kind = value;
  (this->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject =
       (_func_int **)&PTR__TypeCast_002d6f10;
  CVar2 = destType->arrayElementCategory;
  bVar3 = destType->isRef;
  bVar4 = destType->isConstant;
  (this->targetType).category = destType->category;
  (this->targetType).arrayElementCategory = CVar2;
  (this->targetType).isRef = bVar3;
  (this->targetType).isConstant = bVar4;
  (this->targetType).primitiveType.type = (destType->primitiveType).type;
  BVar5 = destType->arrayElementBoundingSize;
  (this->targetType).boundingSize = destType->boundingSize;
  (this->targetType).arrayElementBoundingSize = BVar5;
  (this->targetType).structure.object = (destType->structure).object;
  (destType->structure).object = (Structure *)0x0;
  (this->source).object = sourceValue;
  return;
}

Assistant:

ASTObject (ObjectType ot, const Context& c) : objectType (ot), context (c) {}